

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelLoader.cpp
# Opt level: O0

void __thiscall iDynTree::ModelLoader::ModelLoader(ModelLoader *this)

{
  void *__s;
  pointer pMVar1;
  unique_ptr<iDynTree::ModelLoader::ModelLoaderPimpl,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
  *in_RDI;
  pointer in_stack_ffffffffffffffb8;
  ModelLoaderPimpl *this_00;
  
  this_00 = (ModelLoaderPimpl *)0x160;
  __s = operator_new(0x160);
  memset(__s,0,(size_t)this_00);
  ModelLoaderPimpl::ModelLoaderPimpl(this_00);
  std::
  unique_ptr<iDynTree::ModelLoader::ModelLoaderPimpl,std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>>
  ::unique_ptr<std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>,void>
            (in_RDI,in_stack_ffffffffffffffb8);
  pMVar1 = std::
           unique_ptr<iDynTree::ModelLoader::ModelLoaderPimpl,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
           ::operator->((unique_ptr<iDynTree::ModelLoader::ModelLoaderPimpl,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
                         *)0x1878f8);
  pMVar1->m_isModelValid = false;
  return;
}

Assistant:

ModelLoader::ModelLoader()
    : m_pimpl(new ModelLoaderPimpl())
    {
        m_pimpl->m_isModelValid = false;
    }